

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O0

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  gengetopt_args_info *in_RDI;
  uint i;
  uint local_c;
  
  free_string_field((char **)0x144417);
  free_string_field((char **)0x144425);
  free_string_field((char **)0x144433);
  free_string_field((char **)0x144441);
  free_string_field((char **)0x14444f);
  free_string_field((char **)0x14445d);
  for (local_c = 0; local_c < in_RDI->inputs_num; local_c = local_c + 1) {
    free(in_RDI->inputs[local_c]);
  }
  if (in_RDI->inputs_num != 0) {
    free(in_RDI->inputs);
  }
  clear_given(in_RDI);
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->input_arg));
  free_string_field (&(args_info->input_orig));
  free_string_field (&(args_info->method_arg));
  free_string_field (&(args_info->method_orig));
  free_string_field (&(args_info->npoints_orig));
  free_string_field (&(args_info->delta_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}